

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_sub>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  int local_ac;
  float *local_a0;
  float *local_98;
  float *local_90;
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int i;
  binary_op_sub op;
  int size_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  local_a0 = outptr;
  local_98 = ptr1;
  local_90 = ptr;
  for (local_ac = 0; local_ac + 3 < size; local_ac = local_ac + 4) {
    local_18 = (float)*(undefined8 *)local_90;
    fStack_14 = (float)((ulong)*(undefined8 *)local_90 >> 0x20);
    fStack_10 = (float)*(undefined8 *)(local_90 + 2);
    fStack_c = (float)((ulong)*(undefined8 *)(local_90 + 2) >> 0x20);
    ptr_local._0_4_ = (float)*(undefined8 *)local_98;
    ptr_local._4_4_ = (float)((ulong)*(undefined8 *)local_98 >> 0x20);
    fStack_20 = (float)*(undefined8 *)(local_98 + 2);
    fStack_1c = (float)((ulong)*(undefined8 *)(local_98 + 2) >> 0x20);
    *(ulong *)local_a0 = CONCAT44(fStack_14 - ptr_local._4_4_,local_18 - ptr_local._0_4_);
    *(ulong *)(local_a0 + 2) = CONCAT44(fStack_c - fStack_1c,fStack_10 - fStack_20);
    local_90 = local_90 + 4;
    local_98 = local_98 + 4;
    local_a0 = local_a0 + 4;
  }
  for (; local_ac < size; local_ac = local_ac + 1) {
    *local_a0 = *local_90 - *local_98;
    local_90 = local_90 + 1;
    local_98 = local_98 + 1;
    local_a0 = local_a0 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}